

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiNoncentralAbsolutePoseSacProblem.hpp
# Opt level: O1

void __thiscall
opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem::
MultiNoncentralAbsolutePoseSacProblem
          (MultiNoncentralAbsolutePoseSacProblem *this,adapter_t *adapter,bool asCentral)

{
  int iVar1;
  undefined4 extraout_var;
  size_t i;
  ulong uVar2;
  vector<int,_std::allocator<int>_> numberCorrespondences;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::
  MultiSampleConsensusProblem
            (&this->super_MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,true);
  (this->super_MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
  _vptr_MultiSampleConsensusProblem = (_func_int **)&PTR__MultiSampleConsensusProblem_0020ec68;
  this->_adapter = adapter;
  this->_asCentral = asCentral;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  uVar2 = 0;
  while( true ) {
    iVar1 = (*(adapter->super_AbsoluteAdapterBase)._vptr_AbsoluteAdapterBase[0xe])(adapter);
    if (CONCAT44(extraout_var,iVar1) <= uVar2) break;
    local_6c = (*(adapter->super_AbsoluteAdapterBase)._vptr_AbsoluteAdapterBase[0xd])(adapter,uVar2)
    ;
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_68,
                 (iterator)
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_6c);
    }
    else {
      *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_6c;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    uVar2 = uVar2 + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&local_68);
  sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::setUniformIndices
            (&this->super_MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,
             &local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

MultiNoncentralAbsolutePoseSacProblem(adapter_t & adapter, bool asCentral = false) :
      sac::MultiSampleConsensusProblem<model_t> (),
      _adapter(adapter),
      _asCentral(asCentral)
  {
    std::vector<int> numberCorrespondences;
    for(size_t i = 0; i < adapter.getNumberFrames(); i++)
      numberCorrespondences.push_back(adapter.getNumberCorrespondences(i));
    setUniformIndices(numberCorrespondences);
  }